

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O2

void __thiscall
ChaCha20Aligned::Crypt
          (ChaCha20Aligned *this,Span<const_std::byte> in_bytes,Span<std::byte> out_bytes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  undefined4 uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint32_t uVar60;
  long in_FS_OFFSET;
  byte *local_f0;
  byte *local_e8;
  
  local_f0 = out_bytes.m_data;
  uVar29 = in_bytes.m_size;
  local_e8 = in_bytes.m_data;
  lVar26 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar29 != out_bytes.m_size) {
    __assert_fail("in_bytes.size() == out_bytes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0xa3,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  if (((undefined1  [16])in_bytes & (undefined1  [16])0x3f) == (undefined1  [16])0x0) {
    if (0x3f < uVar29) {
      uVar1 = this->input[0];
      uVar2 = this->input[2];
      uVar3 = this->input[3];
      uVar4 = this->input[6];
      uVar5 = this->input[10];
      uVar6 = this->input[0xb];
      uVar52 = uVar2 + 0x79622d32 ^ uVar5;
      uVar53 = uVar52 << 0x10 | uVar52 >> 0x10;
      uVar38 = uVar4 + uVar53;
      uVar52 = uVar38 ^ uVar2;
      uVar52 = uVar52 << 0xc | uVar52 >> 0x14;
      uVar59 = uVar52 + uVar2 + 0x79622d32;
      uVar53 = uVar53 ^ uVar59;
      uVar54 = uVar53 << 8 | uVar53 >> 0x18;
      uVar38 = uVar38 + uVar54;
      uVar52 = uVar52 ^ uVar38;
      uVar46 = uVar52 << 7 | uVar52 >> 0x19;
      uVar52 = uVar3 + 0x6b206574 ^ uVar6;
      uVar52 = uVar52 << 0x10 | uVar52 >> 0x10;
      uVar7 = this->input[7];
      uVar39 = uVar7 + uVar52;
      uVar53 = uVar39 ^ uVar3;
      uVar47 = uVar53 << 0xc | uVar53 >> 0x14;
      uVar53 = uVar47 + uVar3 + 0x6b206574;
      uVar52 = uVar52 ^ uVar53;
      uVar35 = uVar52 << 8 | uVar52 >> 0x18;
      uVar39 = uVar39 + uVar35;
      uVar47 = uVar47 ^ uVar39;
      uVar47 = uVar47 << 7 | uVar47 >> 0x19;
      uVar59 = uVar59 + uVar47;
      uVar52 = this->input[1];
      uVar8 = this->input[4];
      uVar9 = this->input[5];
      uVar10 = this->input[8];
      uVar60 = this->input[9];
      lVar30 = 0;
      while( true ) {
        uVar27 = uVar10 + (int)lVar30;
        uVar40 = uVar27 ^ uVar1 + 0x61707865;
        uVar41 = uVar40 << 0x10 | uVar40 >> 0x10;
        uVar36 = uVar41 + uVar8;
        uVar40 = uVar36 ^ uVar1;
        uVar40 = uVar40 << 0xc | uVar40 >> 0x14;
        uVar28 = uVar40 + uVar1 + 0x61707865;
        uVar41 = uVar41 ^ uVar28;
        uVar42 = uVar41 << 8 | uVar41 >> 0x18;
        uVar36 = uVar36 + uVar42;
        uVar40 = uVar40 ^ uVar36;
        uVar34 = uVar40 << 7 | uVar40 >> 0x19;
        uVar40 = uVar60 ^ uVar52 + 0x3320646e;
        uVar41 = uVar40 << 0x10 | uVar40 >> 0x10;
        uVar32 = uVar41 + uVar9;
        uVar40 = uVar32 ^ uVar52;
        uVar40 = uVar40 << 0xc | uVar40 >> 0x14;
        uVar50 = uVar40 + uVar52 + 0x3320646e;
        uVar41 = uVar41 ^ uVar50;
        uVar41 = uVar41 << 8 | uVar41 >> 0x18;
        uVar32 = uVar32 + uVar41;
        uVar40 = uVar40 ^ uVar32;
        uVar40 = uVar40 << 7 | uVar40 >> 0x19;
        uVar28 = uVar28 + uVar40;
        uVar55 = uVar28 ^ uVar35;
        uVar56 = uVar55 << 0x10 | uVar55 >> 0x10;
        uVar55 = uVar38 + uVar56;
        uVar40 = uVar40 ^ uVar55;
        uVar40 = uVar40 << 0xc | uVar40 >> 0x14;
        uVar28 = uVar28 + uVar40;
        uVar56 = uVar56 ^ uVar28;
        uVar57 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar40 = uVar40 ^ uVar55;
        uVar33 = uVar40 << 7 | uVar40 >> 0x19;
        uVar50 = uVar50 + uVar46;
        uVar42 = uVar42 ^ uVar50;
        uVar42 = uVar42 << 0x10 | uVar42 >> 0x10;
        uVar40 = uVar42 + uVar39;
        uVar56 = uVar40 ^ uVar46;
        uVar56 = uVar56 << 0xc | uVar56 >> 0x14;
        uVar50 = uVar50 + uVar56;
        uVar42 = uVar42 ^ uVar50;
        uVar43 = uVar42 << 8 | uVar42 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar56 = uVar56 ^ uVar40;
        uVar48 = uVar56 << 7 | uVar56 >> 0x19;
        uVar41 = uVar41 ^ uVar59;
        uVar56 = uVar41 << 0x10 | uVar41 >> 0x10;
        uVar36 = uVar36 + uVar56;
        uVar41 = uVar36 ^ uVar47;
        uVar42 = uVar41 << 0xc | uVar41 >> 0x14;
        uVar41 = uVar42 + uVar59;
        uVar56 = uVar56 ^ uVar41;
        uVar37 = uVar56 << 8 | uVar56 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar42 = uVar42 ^ uVar36;
        uVar31 = uVar42 << 7 | uVar42 >> 0x19;
        uVar42 = uVar34 + uVar53;
        uVar56 = uVar42 ^ uVar54;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar41 = uVar41 + uVar48;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar48 = uVar48 ^ uVar55;
        uVar48 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar31;
        uVar57 = uVar57 ^ uVar42;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar40 = uVar40 + uVar57;
        uVar31 = uVar31 ^ uVar40;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar57 = uVar57 << 0x10 | uVar57 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar28 = uVar28 + uVar33;
        uVar57 = uVar57 ^ uVar28;
        uVar58 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar58;
        uVar33 = uVar33 ^ uVar55;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar48 = uVar48 << 0xc | uVar48 >> 0x14;
        uVar50 = uVar50 + uVar48;
        uVar43 = uVar43 ^ uVar50;
        uVar43 = uVar43 << 8 | uVar43 >> 0x18;
        uVar40 = uVar40 + uVar43;
        uVar48 = uVar48 ^ uVar40;
        uVar57 = uVar48 << 7 | uVar48 >> 0x19;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar41 = uVar41 + uVar31;
        uVar37 = uVar37 ^ uVar41;
        uVar37 = uVar37 << 8 | uVar37 >> 0x18;
        uVar36 = uVar36 + uVar37;
        uVar31 = uVar31 ^ uVar36;
        uVar31 = uVar31 << 7 | uVar31 >> 0x19;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar42 = uVar42 + uVar34;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar56;
        uVar34 = uVar34 ^ uVar32;
        uVar34 = uVar34 << 7 | uVar34 >> 0x19;
        uVar28 = uVar28 + uVar34;
        uVar43 = uVar43 ^ uVar28;
        uVar43 = uVar43 << 0x10 | uVar43 >> 0x10;
        uVar36 = uVar36 + uVar43;
        uVar34 = uVar34 ^ uVar36;
        uVar48 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar28 = uVar28 + uVar48;
        uVar43 = uVar43 ^ uVar28;
        uVar44 = uVar43 << 8 | uVar43 >> 0x18;
        uVar50 = uVar50 + uVar33;
        uVar37 = uVar37 ^ uVar50;
        uVar34 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar32 = uVar32 + uVar34;
        uVar33 = uVar33 ^ uVar32;
        uVar33 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar50 = uVar50 + uVar33;
        uVar34 = uVar34 ^ uVar50;
        uVar37 = uVar34 << 8 | uVar34 >> 0x18;
        uVar32 = uVar32 + uVar37;
        uVar33 = uVar33 ^ uVar32;
        uVar34 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar57;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar55 = uVar55 + uVar56;
        uVar57 = uVar57 ^ uVar55;
        uVar33 = uVar57 << 0xc | uVar57 >> 0x14;
        uVar41 = uVar41 + uVar33;
        uVar56 = uVar56 ^ uVar41;
        uVar56 = uVar56 << 8 | uVar56 >> 0x18;
        uVar55 = uVar55 + uVar56;
        uVar33 = uVar33 ^ uVar55;
        uVar49 = uVar33 << 7 | uVar33 >> 0x19;
        uVar42 = uVar42 + uVar31;
        uVar58 = uVar58 ^ uVar42;
        uVar43 = uVar58 << 0x10 | uVar58 >> 0x10;
        uVar40 = uVar40 + uVar43;
        uVar31 = uVar31 ^ uVar40;
        uVar33 = uVar31 << 0xc | uVar31 >> 0x14;
        uVar42 = uVar42 + uVar33;
        uVar43 = uVar43 ^ uVar42;
        uVar31 = uVar43 << 8 | uVar43 >> 0x18;
        uVar36 = uVar36 + uVar44;
        uVar40 = uVar40 + uVar31;
        uVar33 = uVar33 ^ uVar40;
        uVar28 = uVar28 + uVar34;
        uVar31 = uVar31 ^ uVar28;
        uVar57 = uVar31 << 0x10 | uVar31 >> 0x10;
        uVar55 = uVar55 + uVar57;
        uVar34 = uVar34 ^ uVar55;
        uVar43 = uVar34 << 0xc | uVar34 >> 0x14;
        uVar50 = uVar50 + uVar49;
        uVar44 = uVar44 ^ uVar50;
        uVar31 = uVar44 << 0x10 | uVar44 >> 0x10;
        uVar40 = uVar40 + uVar31;
        uVar49 = uVar49 ^ uVar40;
        uVar58 = uVar49 << 0xc | uVar49 >> 0x14;
        uVar57 = uVar43 + uVar28 ^ uVar57;
        uVar31 = uVar58 + uVar50 ^ uVar31;
        uVar48 = uVar48 ^ uVar36;
        uVar33 = uVar33 << 7 | uVar33 >> 0x19;
        uVar41 = uVar41 + uVar33;
        uVar37 = uVar37 ^ uVar41;
        uVar34 = uVar37 << 0x10 | uVar37 >> 0x10;
        uVar36 = uVar36 + uVar34;
        uVar33 = uVar33 ^ uVar36;
        uVar37 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar34 = uVar37 + uVar41 ^ uVar34;
        uVar33 = uVar48 << 7 | uVar48 >> 0x19;
        uVar42 = uVar42 + uVar33;
        uVar56 = uVar56 ^ uVar42;
        uVar56 = uVar56 << 0x10 | uVar56 >> 0x10;
        uVar32 = uVar32 + uVar56;
        uVar33 = uVar33 ^ uVar32;
        uVar48 = uVar33 << 0xc | uVar33 >> 0x14;
        uVar56 = uVar48 + uVar42 ^ uVar56;
        uVar31 = uVar31 << 8 | uVar31 >> 0x18;
        uVar40 = uVar40 + uVar31;
        uVar33 = uVar40 ^ uVar58;
        uVar49 = uVar34 << 8 | uVar34 >> 0x18;
        uVar36 = uVar36 + uVar49;
        uVar34 = uVar36 ^ uVar37;
        uVar44 = uVar56 << 8 | uVar56 >> 0x18;
        uVar32 = uVar32 + uVar44;
        uVar51 = uVar32 ^ uVar48;
        uVar57 = uVar57 << 8 | uVar57 >> 0x18;
        uVar55 = uVar55 + uVar57;
        uVar56 = uVar55 ^ uVar43;
        uVar45 = uVar49 + uVar60;
        uVar11 = *(undefined4 *)(local_e8 + 4);
        uVar12 = *(undefined4 *)(local_e8 + 8);
        uVar13 = *(undefined4 *)(local_e8 + 0xc);
        uVar14 = *(undefined4 *)(local_e8 + 0x10);
        uVar15 = *(undefined4 *)(local_e8 + 0x14);
        uVar16 = *(undefined4 *)(local_e8 + 0x18);
        uVar17 = *(undefined4 *)(local_e8 + 0x1c);
        uVar18 = *(undefined4 *)(local_e8 + 0x20);
        uVar19 = *(undefined4 *)(local_e8 + 0x24);
        uVar20 = *(undefined4 *)(local_e8 + 0x28);
        uVar21 = *(undefined4 *)(local_e8 + 0x2c);
        uVar22 = *(undefined4 *)(local_e8 + 0x30);
        uVar23 = *(undefined4 *)(local_e8 + 0x34);
        uVar24 = *(undefined4 *)(local_e8 + 0x38);
        uVar25 = *(undefined4 *)(local_e8 + 0x3c);
        uVar60 = (uVar27 == 0xffffffff) + uVar60;
        WriteLE32(local_f0,uVar43 + uVar28 + 0x61707865 ^ *(undefined4 *)local_e8);
        WriteLE32(local_f0 + 4,uVar58 + uVar50 + 0x3320646e ^ uVar11);
        WriteLE32(local_f0 + 8,uVar37 + uVar41 + 0x79622d32 ^ uVar12);
        WriteLE32(local_f0 + 0xc,uVar48 + uVar42 + 0x6b206574 ^ uVar13);
        WriteLE32(local_f0 + 0x10,(uVar51 << 7 | uVar51 >> 0x19) + uVar1 ^ uVar14);
        WriteLE32(local_f0 + 0x14,(uVar56 << 7 | uVar56 >> 0x19) + uVar52 ^ uVar15);
        WriteLE32(local_f0 + 0x18,(uVar33 << 7 | uVar33 >> 0x19) + uVar2 ^ uVar16);
        WriteLE32(local_f0 + 0x1c,(uVar34 << 7 | uVar34 >> 0x19) + uVar3 ^ uVar17);
        WriteLE32(local_f0 + 0x20,uVar36 + uVar8 ^ uVar18);
        WriteLE32(local_f0 + 0x24,uVar32 + uVar9 ^ uVar19);
        WriteLE32(local_f0 + 0x28,uVar55 + uVar4 ^ uVar20);
        WriteLE32(local_f0 + 0x2c,uVar40 + uVar7 ^ uVar21);
        WriteLE32(local_f0 + 0x30,uVar31 + uVar27 ^ uVar22);
        WriteLE32(local_f0 + 0x34,uVar45 ^ uVar23);
        WriteLE32(local_f0 + 0x38,uVar44 + uVar5 ^ uVar24);
        WriteLE32(local_f0 + 0x3c,uVar57 + uVar6 ^ uVar25);
        if ((uVar29 >> 6) - 1 == lVar30) break;
        local_e8 = local_e8 + 0x40;
        lVar30 = lVar30 + 1;
        local_f0 = local_f0 + 0x40;
      }
      this->input[8] = uVar10 + (int)lVar30 + 1;
      this->input[9] = uVar60;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar26) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("blocks * BLOCKLEN == out_bytes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                ,0xa7,"void ChaCha20Aligned::Crypt(Span<const std::byte>, Span<std::byte>)");
}

Assistant:

inline void ChaCha20Aligned::Crypt(Span<const std::byte> in_bytes, Span<std::byte> out_bytes) noexcept
{
    assert(in_bytes.size() == out_bytes.size());
    const unsigned char* m = UCharCast(in_bytes.data());
    unsigned char* c = UCharCast(out_bytes.data());
    size_t blocks = out_bytes.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == out_bytes.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        x0 ^= ReadLE32(m + 0);
        x1 ^= ReadLE32(m + 4);
        x2 ^= ReadLE32(m + 8);
        x3 ^= ReadLE32(m + 12);
        x4 ^= ReadLE32(m + 16);
        x5 ^= ReadLE32(m + 20);
        x6 ^= ReadLE32(m + 24);
        x7 ^= ReadLE32(m + 28);
        x8 ^= ReadLE32(m + 32);
        x9 ^= ReadLE32(m + 36);
        x10 ^= ReadLE32(m + 40);
        x11 ^= ReadLE32(m + 44);
        x12 ^= ReadLE32(m + 48);
        x13 ^= ReadLE32(m + 52);
        x14 ^= ReadLE32(m + 56);
        x15 ^= ReadLE32(m + 60);

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
        m += BLOCKLEN;
    }
}